

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O0

void __thiscall
QTextDocumentFragment::QTextDocumentFragment(QTextDocumentFragment *this,QTextDocument *document)

{
  long lVar1;
  void *pvVar2;
  QTextCursor *in_RSI;
  QTextDocument *in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  MoveMode in_stack_00000008;
  MoveOperation in_stack_0000000c;
  QTextCursor *in_stack_00000010;
  QTextCursor cursor;
  QTextDocument *_cursor;
  QTextDocumentFragmentPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0;
  if (in_RSI != (QTextCursor *)0x0) {
    this_00 = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    _cursor = in_RDI;
    QTextCursor::QTextCursor(in_RSI,in_RDI);
    QTextCursor::movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    pvVar2 = operator_new(0x18);
    QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this_00,(QTextCursor *)_cursor);
    *(void **)in_RDI = pvVar2;
    QTextCursor::~QTextCursor((QTextCursor *)0x7e8edf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTextDocumentFragment::QTextDocumentFragment(const QTextDocument *document)
    : d(nullptr)
{
    if (!document)
        return;

    QTextCursor cursor(const_cast<QTextDocument *>(document));
    cursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    d = new QTextDocumentFragmentPrivate(cursor);
}